

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np2_opna.cpp
# Opt level: O0

void __thiscall NP2OPNA<FM::OPNB>::setRate(NP2OPNA<FM::OPNB> *this,uint32_t rate,uint32_t clock)

{
  bool bVar1;
  uint local_2c;
  uint32_t chipRate;
  uint32_t clock_local;
  uint32_t rate_local;
  NP2OPNA<FM::OPNB> *this_local;
  
  OPNChipBaseT<NP2OPNA<FM::OPNB>_>::setRate((OPNChipBaseT<NP2OPNA<FM::OPNB>_> *)this,rate,clock);
  bVar1 = OPNChipBaseT<NP2OPNA<FM::OPNB>_>::isRunningAtPcmRate
                    ((OPNChipBaseT<NP2OPNA<FM::OPNB>_> *)this);
  local_2c = rate;
  if (!bVar1) {
    local_2c = OPNChipBaseT<NP2OPNA<FM::OPNB>_>::nativeRate
                         ((OPNChipBaseT<NP2OPNA<FM::OPNB>_> *)this);
  }
  FM::OPNB::SetRate(this->chip,clock,local_2c,false);
  FM::OPNB::SetReg(this->chip,0x29,0x9f);
  return;
}

Assistant:

void NP2OPNA<ChipType>::setRate(uint32_t rate, uint32_t clock)
{
    ChipBase::setRate(rate, clock);
    uint32_t chipRate = ChipBase::isRunningAtPcmRate() ? rate : ChipBase::nativeRate();
    chip->SetRate(clock, chipRate, false);  // implies Reset()
    chip->SetReg(0x29, 0x9f);  // enable channels 4-6
}